

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O1

int Cba_NtkPrepareBits(Cba_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  
  uVar1 = (p->vFonObj).nCap;
  if ((p->vFonCopy).nCap < (int)uVar1) {
    piVar3 = (p->vFonCopy).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar3 = (int *)realloc(piVar3,(long)(int)uVar1 << 2);
    }
    (p->vFonCopy).pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vFonCopy).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vFonCopy).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vFonCopy).nSize = uVar1;
  iVar4 = 0;
  if (1 < (p->vFonObj).nSize) {
    iVar4 = 0;
    lVar5 = 1;
    do {
      if ((p->vFonCopy).nSize <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = (p->vFonCopy).pArray;
      if (piVar3[lVar5] != 0) {
        __assert_fail("Cba_FonCopy(p, f) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x189,"void Cba_FonSetCopy(Cba_Ntk_t *, int, int)");
      }
      piVar3[lVar5] = iVar4;
      iVar2 = Cba_FonRangeSize(p,(int)lVar5);
      iVar4 = iVar4 + iVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (p->vFonObj).nSize);
  }
  return iVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Helper functions.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Cba_NtkPrepareBits( Cba_Ntk_t * p )
{
    int i, nBits = 0;
    Cba_NtkCleanFonCopies( p );
    Cba_NtkForEachFon( p, i )
    {
        Cba_FonSetCopy( p, i, nBits );
        nBits += Cba_FonRangeSize( p, i );
    }
    return nBits;
}